

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionFromMatrix(Matrix mat)

{
  uint uVar1;
  ulong uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Quaternion QVar8;
  float in_stack_00000008;
  
  fVar4 = in_stack_00000008 + mat.m12 + mat.m2;
  fVar5 = (in_stack_00000008 - mat.m12) - mat.m2;
  fVar7 = (mat.m12 - in_stack_00000008) - mat.m2;
  fVar6 = fVar5;
  if (fVar5 <= fVar4) {
    fVar6 = fVar4;
  }
  uVar1 = 2;
  if (fVar7 <= fVar6) {
    uVar1 = (uint)(fVar4 < fVar5);
  }
  fVar4 = (mat.m2 - in_stack_00000008) - mat.m12;
  if (fVar7 <= fVar6) {
    fVar7 = fVar6;
  }
  uVar2 = 3;
  if (fVar4 <= fVar7) {
    uVar2 = (ulong)uVar1;
    fVar4 = fVar7;
  }
  uVar3 = 0;
  if (fVar4 + 1.0 < 0.0) {
    sqrtf(fVar4 + 1.0);
  }
  QVar8._0_8_ = (*(code *)(&DAT_00189370 + *(int *)(&DAT_00189370 + uVar2 * 4)))();
  QVar8.z = (float)(int)uVar3;
  QVar8.w = (float)(int)((ulong)uVar3 >> 0x20);
  return QVar8;
}

Assistant:

RMAPI Quaternion QuaternionFromMatrix(Matrix mat)
{
    Quaternion result = { 0 };

    float fourWSquaredMinus1 = mat.m0  + mat.m5 + mat.m10;
    float fourXSquaredMinus1 = mat.m0  - mat.m5 - mat.m10;
    float fourYSquaredMinus1 = mat.m5  - mat.m0 - mat.m10;
    float fourZSquaredMinus1 = mat.m10 - mat.m0 - mat.m5;

    int biggestIndex = 0;
    float fourBiggestSquaredMinus1 = fourWSquaredMinus1;
    if (fourXSquaredMinus1 > fourBiggestSquaredMinus1)
    {
        fourBiggestSquaredMinus1 = fourXSquaredMinus1;
        biggestIndex = 1;
    }

    if (fourYSquaredMinus1 > fourBiggestSquaredMinus1)
    {
        fourBiggestSquaredMinus1 = fourYSquaredMinus1;
        biggestIndex = 2;
    }

    if (fourZSquaredMinus1 > fourBiggestSquaredMinus1)
    {
        fourBiggestSquaredMinus1 = fourZSquaredMinus1;
        biggestIndex = 3;
    }

    float biggestVal = sqrtf(fourBiggestSquaredMinus1 + 1.0f)*0.5f;
    float mult = 0.25f/biggestVal;

    switch (biggestIndex)
    {
        case 0:
            result.w = biggestVal;
            result.x = (mat.m6 - mat.m9)*mult;
            result.y = (mat.m8 - mat.m2)*mult;
            result.z = (mat.m1 - mat.m4)*mult;
            break;
        case 1:
            result.x = biggestVal;
            result.w = (mat.m6 - mat.m9)*mult;
            result.y = (mat.m1 + mat.m4)*mult;
            result.z = (mat.m8 + mat.m2)*mult;
            break;
        case 2:
            result.y = biggestVal;
            result.w = (mat.m8 - mat.m2)*mult;
            result.x = (mat.m1 + mat.m4)*mult;
            result.z = (mat.m6 + mat.m9)*mult;
            break;
        case 3:
            result.z = biggestVal;
            result.w = (mat.m1 - mat.m4)*mult;
            result.x = (mat.m8 + mat.m2)*mult;
            result.y = (mat.m6 + mat.m9)*mult;
            break;
    }

    return result;
}